

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_test.cc
# Opt level: O0

void __thiscall cpsm::testing::Matches::assert_not_matched(Matches *this,string_ref item)

{
  string_ref item_00;
  basic_string_ref<char,_std::char_traits<char>_> args_1;
  bool bVar1;
  undefined8 uVar2;
  TestAssertionFailure *in_RDX;
  char *in_RSI;
  char *in_RDI;
  Matches *in_stack_ffffffffffffffd0;
  TestAssertionFailure *this_00;
  char *pcVar3;
  
  item_00.len_ = (size_t)in_RDX;
  item_00.ptr_ = in_RSI;
  this_00 = in_RDX;
  pcVar3 = in_RSI;
  bVar1 = matched(in_stack_ffffffffffffffd0,item_00);
  if (!bVar1) {
    return;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  args_1.len_ = (size_t)pcVar3;
  args_1.ptr_ = in_RDI;
  TestAssertionFailure::
  TestAssertionFailure<char_const*,boost::basic_string_ref<char,std::char_traits<char>>,char_const*>
            (this_00,in_RSI,args_1,(char *)in_RDX);
  __cxa_throw(uVar2,&TestAssertionFailure::typeinfo,TestAssertionFailure::~TestAssertionFailure);
}

Assistant:

void assert_not_matched(boost::string_ref const item) const {
    if (matched(item)) {
      throw TestAssertionFailure("incorrectly matched '", item, "'");
    }
  }